

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_superblock.c
# Opt level: O0

size_t ZSTD_compressSubBlock_literal
                 (HUF_CElt *hufTable,ZSTD_hufCTablesMetadata_t *hufMetadata,BYTE *literals,
                 size_t litSize,void *dst,size_t dstSize,int bmi2,int writeEntropy,
                 int *entropyWritten)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  size_t local_98;
  symbolEncodingType_e local_90;
  U32 lhc_2;
  U32 lhc_1;
  U32 lhc;
  size_t cSize;
  size_t cLitSize;
  symbolEncodingType_e hType;
  U32 singleStream;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  size_t lhSize;
  size_t header;
  size_t dstSize_local;
  void *dst_local;
  size_t litSize_local;
  BYTE *literals_local;
  ZSTD_hufCTablesMetadata_t *hufMetadata_local;
  HUF_CElt *hufTable_local;
  
  iVar1 = 0;
  if (writeEntropy != 0) {
    iVar1 = 200;
  }
  uVar3 = (ulong)(int)((0x400U - (long)iVar1 <= litSize) + 3 +
                      (uint)(0x4000U - (long)iVar1 <= litSize));
  _hType = (void *)((long)dst + uVar3);
  if (writeEntropy == 0) {
    local_90 = set_repeat;
  }
  else {
    local_90 = hufMetadata->hType;
  }
  cSize = 0;
  *entropyWritten = 0;
  if ((litSize == 0) || (hufMetadata->hType == set_basic)) {
    hufTable_local = (HUF_CElt *)ZSTD_noCompressLiterals(dst,dstSize,literals,litSize);
  }
  else if (hufMetadata->hType == set_rle) {
    hufTable_local = (HUF_CElt *)ZSTD_compressRleLiteralsBlock(dst,dstSize,literals,litSize);
  }
  else {
    if ((writeEntropy != 0) && (hufMetadata->hType == set_compressed)) {
      memcpy(_hType,hufMetadata->hufDesBuffer,hufMetadata->hufDesSize);
      _hType = (void *)(hufMetadata->hufDesSize + (long)_hType);
      cSize = hufMetadata->hufDesSize;
    }
    if (uVar3 == 3) {
      local_98 = HUF_compress1X_usingCTable
                           (_hType,(long)dst + (dstSize - (long)_hType),literals,litSize,hufTable);
    }
    else {
      local_98 = HUF_compress4X_usingCTable
                           (_hType,(long)dst + (dstSize - (long)_hType),literals,litSize,hufTable);
    }
    uVar4 = local_98 + cSize;
    if ((local_98 == 0) || (uVar2 = ERR_isError(local_98), uVar2 != 0)) {
      hufTable_local = (HUF_CElt *)0x0;
    }
    else if ((writeEntropy == 0) && (litSize <= uVar4)) {
      hufTable_local = (HUF_CElt *)ZSTD_noCompressLiterals(dst,dstSize,literals,litSize);
    }
    else if (uVar3 < (ulong)(long)(int)((0x3ff < uVar4) + 3 + (uint)(0x3fff < uVar4))) {
      hufTable_local = (HUF_CElt *)ZSTD_noCompressLiterals(dst,dstSize,literals,litSize);
    }
    else {
      iVar1 = (int)litSize;
      iVar5 = (int)uVar4;
      if (uVar3 == 3) {
        MEM_writeLE24(dst,local_90 + (uint)((uVar3 == 3 ^ 0xffU) & 1) * 4 + iVar1 * 0x10 +
                          iVar5 * 0x4000);
      }
      else if (uVar3 == 4) {
        MEM_writeLE32(dst,local_90 + 8 + iVar1 * 0x10 + iVar5 * 0x40000);
      }
      else if (uVar3 == 5) {
        MEM_writeLE32(dst,local_90 + 0xc + iVar1 * 0x10 + iVar5 * 0x400000);
        *(char *)((long)dst + 4) = (char)(uVar4 >> 10);
      }
      *entropyWritten = 1;
      hufTable_local = (HUF_CElt *)((long)_hType + (local_98 - (long)dst));
    }
  }
  return (size_t)hufTable_local;
}

Assistant:

static size_t ZSTD_compressSubBlock_literal(const HUF_CElt* hufTable,
                                    const ZSTD_hufCTablesMetadata_t* hufMetadata,
                                    const BYTE* literals, size_t litSize,
                                    void* dst, size_t dstSize,
                                    const int bmi2, int writeEntropy, int* entropyWritten)
{
    size_t const header = writeEntropy ? 200 : 0;
    size_t const lhSize = 3 + (litSize >= (1 KB - header)) + (litSize >= (16 KB - header));
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart + lhSize;
    U32 const singleStream = lhSize == 3;
    symbolEncodingType_e hType = writeEntropy ? hufMetadata->hType : set_repeat;
    size_t cLitSize = 0;

    (void)bmi2; /* TODO bmi2... */

    DEBUGLOG(5, "ZSTD_compressSubBlock_literal (litSize=%zu, lhSize=%zu, writeEntropy=%d)", litSize, lhSize, writeEntropy);

    *entropyWritten = 0;
    if (litSize == 0 || hufMetadata->hType == set_basic) {
      DEBUGLOG(5, "ZSTD_compressSubBlock_literal using raw literal");
      return ZSTD_noCompressLiterals(dst, dstSize, literals, litSize);
    } else if (hufMetadata->hType == set_rle) {
      DEBUGLOG(5, "ZSTD_compressSubBlock_literal using rle literal");
      return ZSTD_compressRleLiteralsBlock(dst, dstSize, literals, litSize);
    }

    assert(litSize > 0);
    assert(hufMetadata->hType == set_compressed || hufMetadata->hType == set_repeat);

    if (writeEntropy && hufMetadata->hType == set_compressed) {
        ZSTD_memcpy(op, hufMetadata->hufDesBuffer, hufMetadata->hufDesSize);
        op += hufMetadata->hufDesSize;
        cLitSize += hufMetadata->hufDesSize;
        DEBUGLOG(5, "ZSTD_compressSubBlock_literal (hSize=%zu)", hufMetadata->hufDesSize);
    }

    /* TODO bmi2 */
    {   const size_t cSize = singleStream ? HUF_compress1X_usingCTable(op, oend-op, literals, litSize, hufTable)
                                          : HUF_compress4X_usingCTable(op, oend-op, literals, litSize, hufTable);
        op += cSize;
        cLitSize += cSize;
        if (cSize == 0 || ERR_isError(cSize)) {
            DEBUGLOG(5, "Failed to write entropy tables %s", ZSTD_getErrorName(cSize));
            return 0;
        }
        /* If we expand and we aren't writing a header then emit uncompressed */
        if (!writeEntropy && cLitSize >= litSize) {
            DEBUGLOG(5, "ZSTD_compressSubBlock_literal using raw literal because uncompressible");
            return ZSTD_noCompressLiterals(dst, dstSize, literals, litSize);
        }
        /* If we are writing headers then allow expansion that doesn't change our header size. */
        if (lhSize < (size_t)(3 + (cLitSize >= 1 KB) + (cLitSize >= 16 KB))) {
            assert(cLitSize > litSize);
            DEBUGLOG(5, "Literals expanded beyond allowed header size");
            return ZSTD_noCompressLiterals(dst, dstSize, literals, litSize);
        }
        DEBUGLOG(5, "ZSTD_compressSubBlock_literal (cSize=%zu)", cSize);
    }

    /* Build header */
    switch(lhSize)
    {
    case 3: /* 2 - 2 - 10 - 10 */
        {   U32 const lhc = hType + ((!singleStream) << 2) + ((U32)litSize<<4) + ((U32)cLitSize<<14);
            MEM_writeLE24(ostart, lhc);
            break;
        }
    case 4: /* 2 - 2 - 14 - 14 */
        {   U32 const lhc = hType + (2 << 2) + ((U32)litSize<<4) + ((U32)cLitSize<<18);
            MEM_writeLE32(ostart, lhc);
            break;
        }
    case 5: /* 2 - 2 - 18 - 18 */
        {   U32 const lhc = hType + (3 << 2) + ((U32)litSize<<4) + ((U32)cLitSize<<22);
            MEM_writeLE32(ostart, lhc);
            ostart[4] = (BYTE)(cLitSize >> 10);
            break;
        }
    default:  /* not possible : lhSize is {3,4,5} */
        assert(0);
    }
    *entropyWritten = 1;
    DEBUGLOG(5, "Compressed literals: %u -> %u", (U32)litSize, (U32)(op-ostart));
    return op-ostart;
}